

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O1

void llb_build_key_get_filtered_directory_filters
               (llb_build_key_t *key,void *context,IteratorFunction iterator)

{
  uint64_t *puVar1;
  char *pcVar2;
  llb_data_t lVar3;
  pointer pSVar4;
  llb_data_t data;
  StringList filters;
  llb_data_t local_88;
  BinaryDecoder local_78;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_58;
  StringList local_40;
  
  local_78.data =
       llbuild::buildsystem::BuildKey::getContentExclusionPatterns((BuildKey *)(key + 0x10));
  local_78.pos = 0;
  llbuild::basic::StringList::StringList(&local_40,&local_78);
  llbuild::basic::StringList::getValues(&local_58,&local_40);
  if (local_58.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_58.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    puVar1 = &local_78.pos;
    pSVar4 = local_58.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pcVar2 = pSVar4->Data;
      local_88.length = pSVar4->Length;
      if (pcVar2 == (char *)0x0) {
        local_78.data.Length = 0;
        local_78.data.Data = (char *)puVar1;
        local_78.pos = local_78.pos & 0xffffffffffffff00;
      }
      else {
        local_78.data.Data = (char *)puVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,pcVar2,pcVar2 + local_88.length);
      }
      pcVar2 = local_78.data.Data;
      local_88.data = (uint8_t *)strdup(local_78.data.Data);
      if ((uint64_t *)pcVar2 != puVar1) {
        operator_delete(pcVar2,local_78.pos + 1);
      }
      lVar3.data = local_88.data;
      lVar3.length = local_88.length;
      (*iterator)(context,lVar3);
      llb_data_destroy(&local_88);
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != local_58.
                       super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl
                       .super__Vector_impl_data._M_finish);
  }
  if (local_58.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_40.contents != (char *)0x0) {
    operator_delete__(local_40.contents);
  }
  return;
}

Assistant:

void llb_build_key_get_filtered_directory_filters(llb_build_key_t *key, void *context, IteratorFunction iterator) {
  auto filters = ((CAPIBuildKey *)key)->getInternalBuildKey().getContentExclusionPatternsAsStringList();
  for (auto filter: filters.getValues()) {
    llb_data_t data;
    data.length = filter.size();
    data.data = (const uint8_t*)strdup(filter.str().c_str());
    iterator(context, data);
    llb_data_destroy(&data);
  }
}